

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O3

sljit_s32 emit_shift_with_flags
                    (sljit_compiler *compiler,sljit_u8 mode,sljit_s32 set_flags,sljit_s32 dst,
                    sljit_sw dstw,sljit_s32 src1,sljit_sw src1w,sljit_s32 src2,sljit_sw src2w)

{
  sljit_s32 sVar1;
  
  if ((src2 & 0x40U) == 0) {
    if (set_flags != 0) {
      if (dst < 0x40) {
        sVar1 = emit_shift(compiler,mode,dst,dstw,src1,src1w,src2,src2w);
        if (sVar1 == 0) {
          sVar1 = 0xf;
          if (dst != 0) {
            sVar1 = dst;
          }
          sVar1 = emit_cmp_binary(compiler,sVar1,dstw,0x40,0);
          return sVar1;
        }
      }
      else {
        sVar1 = emit_cmp_binary(compiler,src1,src1w,0x40,0);
        if ((sVar1 == 0) &&
           (sVar1 = emit_shift(compiler,mode,dst,dstw,src1,src1w,src2,src2w), sVar1 == 0)) {
          return 0;
        }
      }
      return compiler->error;
    }
  }
  else if ((src2w & 0x3fU) == 0) {
    if (set_flags != 0) {
      sVar1 = emit_cum_binary(compiler,0xd0b0908,dst,dstw,src1,src1w,0x40,0);
      return sVar1;
    }
    sVar1 = emit_mov(compiler,dst,dstw,src1,src1w);
    return sVar1;
  }
  sVar1 = emit_shift(compiler,mode,dst,dstw,src1,src1w,src2,src2w);
  return sVar1;
}

Assistant:

static sljit_s32 emit_shift_with_flags(struct sljit_compiler *compiler,
	sljit_u8 mode, sljit_s32 set_flags,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src1, sljit_sw src1w,
	sljit_s32 src2, sljit_sw src2w)
{
	/* The CPU does not set flags if the shift count is 0. */
	if (src2 & SLJIT_IMM) {
#if (defined SLJIT_CONFIG_X86_64 && SLJIT_CONFIG_X86_64)
		if ((src2w & 0x3f) != 0 || (compiler->mode32 && (src2w & 0x1f) != 0))
			return emit_shift(compiler, mode, dst, dstw, src1, src1w, src2, src2w);
#else
		if ((src2w & 0x1f) != 0)
			return emit_shift(compiler, mode, dst, dstw, src1, src1w, src2, src2w);
#endif
		if (!set_flags)
			return emit_mov(compiler, dst, dstw, src1, src1w);
		/* OR dst, src, 0 */
		return emit_cum_binary(compiler, BINARY_OPCODE(OR),
			dst, dstw, src1, src1w, SLJIT_IMM, 0);
	}

	if (!set_flags)
		return emit_shift(compiler, mode, dst, dstw, src1, src1w, src2, src2w);

	if (!FAST_IS_REG(dst))
		FAIL_IF(emit_cmp_binary(compiler, src1, src1w, SLJIT_IMM, 0));

	FAIL_IF(emit_shift(compiler, mode, dst, dstw, src1, src1w, src2, src2w));

	if (FAST_IS_REG(dst))
		return emit_cmp_binary(compiler, (dst == SLJIT_UNUSED) ? TMP_REG1 : dst, dstw, SLJIT_IMM, 0);
	return SLJIT_SUCCESS;
}